

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

common_control_vector_data *
common_control_vector_load
          (common_control_vector_data *__return_storage_ptr__,
          vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
          *load_infos)

{
  long lVar1;
  pointer pfVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  common_log *pcVar8;
  char *pcVar9;
  int *piVar10;
  ulong uVar11;
  pointer pcVar12;
  ulong uVar13;
  common_control_vector_data cur;
  ggml_context *ctx;
  long local_90;
  pointer local_88;
  ulong local_80;
  ulong local_78;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __return_storage_ptr__->n_embd = -1;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar12 = (load_infos->
            super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_88 = (load_infos->
             super__Vector_base<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pcVar12 == local_88) {
LAB_001b9b84:
      if (__return_storage_ptr__->n_embd == -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar8 = common_log_main();
          common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,"%s: no valid control vector files passed\n",
                         "common_control_vector_load");
        }
        pfVar2 = (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl
            .super__Vector_impl_data._M_finish != pfVar2) {
          (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = pfVar2;
        }
      }
      return __return_storage_ptr__;
    }
    cur.n_embd = -1;
    cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ctx = (ggml_context *)0x0;
    lVar7 = gguf_init_from_file((pcVar12->fname)._M_dataplus._M_p,0,&ctx);
    if (lVar7 == 0) {
      if (-1 < common_log_verbosity_thold) {
        pcVar8 = common_log_main();
        common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,
                       "%s: failed to load control vector file from %s\n",
                       "common_control_vector_load_one",(pcVar12->fname)._M_dataplus._M_p);
      }
    }
    else {
      uVar4 = gguf_get_n_tensors(lVar7);
      if ((uVar4 == 0) && (-1 < common_log_verbosity_thold)) {
        pcVar8 = common_log_main();
        common_log_add(pcVar8,GGML_LOG_LEVEL_WARN,"%s: no direction tensors found in %s\n",
                       "common_control_vector_load_one",(pcVar12->fname)._M_dataplus._M_p);
      }
      local_80 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        local_80 = 0;
      }
      uVar13 = 0;
      local_90 = lVar7;
      while (uVar13 != local_80) {
        local_78 = uVar13;
        pcVar9 = (char *)gguf_get_tensor_name(lVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar9,(allocator<char> *)&local_50);
        lVar7 = std::__cxx11::string::find((char)&name,0x2e);
        if (lVar7 == -1) {
LAB_001b99e9:
          if (-1 < common_log_verbosity_thold) {
            pcVar8 = common_log_main();
            pcVar9 = "%s: invalid/unparsable direction tensor layer index in %s\n";
LAB_001b9a01:
            common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,pcVar9,"common_control_vector_load_one",
                           (pcVar12->fname)._M_dataplus._M_p);
          }
LAB_001b9a19:
          cur.n_embd = -1;
          std::__cxx11::string::~string((string *)&name);
          lVar7 = local_90;
          break;
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&name);
        bVar3 = std::operator==(&local_50,"direction");
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar3) goto LAB_001b99e9;
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&name);
        iVar5 = std::__cxx11::stoi(&local_50,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_50);
        if (iVar5 < 0) goto LAB_001b99e9;
        if (iVar5 == 0) {
          if (common_log_verbosity_thold < 0) goto LAB_001b9a19;
          pcVar8 = common_log_main();
          pcVar9 = "%s: invalid (zero) direction tensor layer index in %s\n";
          goto LAB_001b9a01;
        }
        piVar10 = (int *)ggml_get_tensor(ctx,CONCAT44(name._M_dataplus._M_p._4_4_,
                                                      name._M_dataplus._M_p._0_4_));
        if (*piVar10 != 0) {
          if (-1 < common_log_verbosity_thold) {
            pcVar8 = common_log_main();
            pcVar9 = "%s: invalid (non-F32) direction tensor type in %s\n";
LAB_001b99b2:
            common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,pcVar9,"common_control_vector_load_one",
                           (pcVar12->fname)._M_dataplus._M_p);
          }
          goto LAB_001b9a19;
        }
        iVar6 = ggml_n_dims(piVar10);
        if (iVar6 != 1) {
          if (-1 < common_log_verbosity_thold) {
            pcVar8 = common_log_main();
            pcVar9 = "%s: invalid (non-1D) direction tensor shape in %s\n";
            goto LAB_001b99b2;
          }
          goto LAB_001b9a19;
        }
        if (cur.n_embd == -1) {
          cur.n_embd = ggml_nelements(piVar10);
        }
        else {
          lVar7 = ggml_nelements(piVar10);
          if (lVar7 != cur.n_embd) {
            if (-1 < common_log_verbosity_thold) {
              pcVar8 = common_log_main();
              pcVar9 = "%s: direction tensor in %s does not match previous dimensions\n";
              goto LAB_001b99b2;
            }
            goto LAB_001b9a19;
          }
        }
        uVar13 = (long)cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        if (uVar13 <= (ulong)(long)(cur.n_embd * iVar5)) {
          uVar13 = (long)(cur.n_embd * iVar5);
        }
        local_50._M_dataplus._M_p._0_4_ = 0;
        std::vector<float,_std::allocator<float>_>::resize
                  (&cur.data,uVar13,(value_type_conflict6 *)&local_50);
        lVar7 = local_90;
        lVar1 = *(long *)(piVar10 + 0x3e);
        iVar5 = (iVar5 + -1) * cur.n_embd;
        uVar13 = (ulong)(uint)cur.n_embd;
        if (cur.n_embd < 1) {
          uVar13 = 0;
        }
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[(long)iVar5 + uVar11] =
               *(float *)(lVar1 + uVar11 * 4) * pcVar12->strength +
               cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[(long)iVar5 + uVar11];
        }
        std::__cxx11::string::~string((string *)&name);
        uVar13 = local_78 + 1;
      }
      if (cur.n_embd == -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar8 = common_log_main();
          common_log_add(pcVar8,GGML_LOG_LEVEL_WARN,
                         "%s: skipping %s due to invalid direction tensors\n",
                         "common_control_vector_load_one",(pcVar12->fname)._M_dataplus._M_p);
        }
        if (cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start) {
          cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
        }
      }
      gguf_free(lVar7);
      ggml_free(ctx);
    }
    if (cur.n_embd == -1) {
LAB_001b9b72:
      __return_storage_ptr__->n_embd = -1;
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&cur.data.super__Vector_base<float,_std::allocator<float>_>);
      goto LAB_001b9b84;
    }
    iVar5 = __return_storage_ptr__->n_embd;
    if (iVar5 != cur.n_embd && iVar5 != -1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar8 = common_log_main();
        common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,
                       "%s: control vectors in %s does not match previous dimensions\n",
                       "common_control_vector_load",(pcVar12->fname)._M_dataplus._M_p);
      }
      goto LAB_001b9b72;
    }
    if (iVar5 == -1) {
      common_control_vector_data::operator=(__return_storage_ptr__,&cur);
    }
    else {
      uVar11 = (long)(__return_storage_ptr__->data).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(__return_storage_ptr__->data).
                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      uVar13 = (long)cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar13 < uVar11) {
        uVar13 = uVar11;
      }
      name._M_dataplus._M_p._0_4_ = 0;
      std::vector<float,_std::allocator<float>_>::resize
                (&__return_storage_ptr__->data,uVar13,(value_type_conflict6 *)&name);
      pfVar2 = (__return_storage_ptr__->data).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (lVar7 = 0;
          (long)cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != lVar7; lVar7 = lVar7 + 1) {
        pfVar2[lVar7] =
             cur.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[lVar7] + pfVar2[lVar7];
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&cur.data.super__Vector_base<float,_std::allocator<float>_>);
    pcVar12 = pcVar12 + 1;
  } while( true );
}

Assistant:

common_control_vector_data common_control_vector_load(const std::vector<common_control_vector_load_info> & load_infos) {
    common_control_vector_data result = { -1, {} };

    for (const auto & info : load_infos) {
        auto cur = common_control_vector_load_one(info);

        if (cur.n_embd == -1) {
            result.n_embd = -1;
            break;
        }
        if (result.n_embd != -1 && result.n_embd != cur.n_embd) {
            LOG_ERR("%s: control vectors in %s does not match previous dimensions\n", __func__, info.fname.c_str());
            result.n_embd = -1;
            break;
        }

        if (result.n_embd == -1) {
            result = std::move(cur);
        } else {
            result.data.resize(std::max(result.data.size(), cur.data.size()), 0.0f);  // extend if necessary
            for (size_t i = 0; i < cur.data.size(); i++) {
                result.data[i] += cur.data[i];
            }
        }
    }

    if (result.n_embd == -1) {
        LOG_ERR("%s: no valid control vector files passed\n", __func__);
        result.data.clear();
    }

    return result;
}